

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidget::resizeEvent(QCalendarWidget *this,QResizeEvent *event)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QResizeEvent *in_RSI;
  QWidget *in_RDI;
  QCalendarWidgetPrivate *d;
  
  d_func((QCalendarWidget *)0x5213c1);
  bVar1 = QWidget::isVisible((QWidget *)0x5213d7);
  if (bVar1) {
    QResizeEvent::size(in_RSI);
    iVar2 = QSize::width((QSize *)0x5213ef);
    QResizeEvent::oldSize(in_RSI);
    iVar3 = QSize::width((QSize *)0x521405);
    if (iVar2 != iVar3) {
      QCalendarWidgetPrivate::_q_yearEditingFinished((QCalendarWidgetPrivate *)event);
    }
  }
  QWidget::resizeEvent(in_RDI,in_RSI);
  return;
}

Assistant:

void QCalendarWidget::resizeEvent(QResizeEvent * event)
{
    Q_D(QCalendarWidget);

    // XXX Should really use a QWidgetStack for yearEdit and yearButton,
    // XXX here we hide the year edit when the layout is likely to break
    // XXX the manual positioning of the yearEdit over the yearButton.
    if (d->yearEdit->isVisible() && event->size().width() != event->oldSize().width())
        d->_q_yearEditingFinished();

    QWidget::resizeEvent(event);
}